

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,4u>>(int bias)

{
  int delta;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint recent;
  uint uVar6;
  uint absDiff;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  bVar9 = false;
  uVar4 = 0;
  do {
    uVar5 = uVar4 & 0xf;
    uVar6 = 0;
    do {
      uVar1 = uVar4 - uVar6;
      if (uVar4 < uVar6 || uVar1 == 0) {
        if ((int)(uVar6 - uVar4) <= (int)(bias + 8U)) goto LAB_001027e0;
        iVar3 = 7;
      }
      else {
        iVar3 = 7;
        if ((int)uVar1 < (int)(8U - bias)) {
LAB_001027e0:
          uVar7 = uVar6 & 0x10 | uVar5;
          uVar2 = uVar6 & 0xf;
          if (uVar2 < uVar5) {
            uVar8 = uVar7 - 0x10;
            if (uVar5 - uVar2 < 8U - bias) {
              uVar8 = uVar7;
            }
          }
          else {
            uVar8 = uVar7 + 0x10;
            if (uVar2 - uVar5 <= bias + 8U) {
              uVar8 = uVar7;
            }
          }
          iVar3 = 1;
          if ((uVar8 == uVar4) &&
             ((bias != 0 || (((uVar1 & 0xf) + uVar6) - (uVar1 * 2 & 0x10) == uVar4)))) {
            iVar3 = 0;
          }
        }
      }
      if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_00102858;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x20);
    iVar3 = 5;
LAB_00102858:
    if ((iVar3 != 5) && (iVar3 != 0)) {
      return bVar9;
    }
    bVar9 = 0x1e < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x20) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}